

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O2

void kmpp_objs_init(void)

{
  int iVar1;
  rk_u64 root;
  uint __fd;
  uint uVar2;
  MPP_RET MVar3;
  rk_s32 rVar4;
  MppTrieInfo *pMVar5;
  KmppObjs *pKVar6;
  MppTrieInfo *pMVar7;
  rk_s32 rVar8;
  MppTrie *ppvVar9;
  ulong uVar10;
  MppTrie local_58;
  rk_u64 uaddr;
  uint local_44;
  KmppObjs *local_40;
  long local_38;
  
  local_58 = (MppTrie)0x0;
  if (objs != (KmppObjs *)0x0) {
    if (((byte)kmpp_obj_debug & 1) != 0) {
      _mpp_log_l(4,"kmpp_obj","objs already inited %p\n",(char *)0x0);
    }
    kmpp_objs_deinit();
  }
  mpp_env_get_u32("kmpp_obj_debug",&kmpp_obj_debug,0);
  __fd = open("/dev/kmpp_objs",2);
  if ((int)__fd < 0) {
    if (((byte)kmpp_obj_debug & 1) != 0) {
      _mpp_log_l(4,"kmpp_obj","%s open failed ret fd %d\n",(char *)0x0,"/dev/kmpp_objs",(ulong)__fd)
      ;
    }
  }
  else {
    uaddr = 0;
    uVar2 = ioctl(__fd,0x40046d01);
    root = uaddr;
    if ((int)uVar2 < 0) {
      _mpp_log_l(2,"kmpp_obj","%s ioctl failed ret %d\n","kmpp_objs_init","/dev/kmpp_objs",
                 (ulong)uVar2);
    }
    else {
      if (((byte)kmpp_obj_debug & 2) != 0) {
        _mpp_log_l(4,"kmpp_obj","query fd %d root %p from kernel\n",(char *)0x0,(ulong)__fd,uaddr);
      }
      MVar3 = mpp_trie_init_by_root(&local_58,(void *)root);
      if (MVar3 == MPP_OK && local_58 != (MppTrie)0x0) {
        if (((byte)kmpp_obj_debug & 2) != 0) {
          mpp_trie_dump(local_58,"kmpp_objs_init");
        }
        pMVar5 = mpp_trie_get_info(local_58,"__count");
        if (pMVar5 == (MppTrieInfo *)0x0) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(uint *)(&pMVar5[1].field_0x0 + (byte)pMVar5->field_0x3);
        }
        local_38 = (long)(int)uVar2;
        pKVar6 = (KmppObjs *)mpp_osal_calloc("kmpp_objs_init",local_38 * 0x20 + 0x28);
        if (pKVar6 != (KmppObjs *)0x0) {
          pKVar6->fd = __fd;
          pKVar6->count = uVar2;
          pKVar6->trie = local_58;
          pKVar6->root = (void *)root;
          pMVar5 = mpp_trie_get_info(local_58,"__offset");
          rVar8 = 0;
          rVar4 = 0;
          if (pMVar5 != (MppTrieInfo *)0x0) {
            rVar4 = *(rk_s32 *)(&pMVar5[1].field_0x0 + (byte)pMVar5->field_0x3);
          }
          pKVar6->entry_offset = rVar4;
          pMVar5 = mpp_trie_get_info(local_58,"__priv");
          if (pMVar5 != (MppTrieInfo *)0x0) {
            rVar8 = *(rk_s32 *)(&pMVar5[1].field_0x0 + (byte)pMVar5->field_0x3);
          }
          pKVar6->priv_offset = rVar8;
          pMVar5 = mpp_trie_get_info(local_58,"__name_offset");
          if (pMVar5 == (MppTrieInfo *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (ulong)*(uint *)(&pMVar5[1].field_0x0 + (byte)pMVar5->field_0x3);
          }
          pKVar6->name_offset = (rk_s32)uVar10;
          if (((byte)kmpp_obj_debug & 2) != 0) {
            _mpp_log_l(4,"kmpp_obj","count %d object offsets - priv %d name %d entry %d\n",
                       (char *)0x0,(ulong)uVar2,(ulong)(uint)pKVar6->priv_offset,uVar10,
                       (ulong)(uint)pKVar6->entry_offset);
          }
          local_44 = uVar2;
          pMVar5 = mpp_trie_get_info_first(local_58);
          ppvVar9 = &pKVar6[1].trie;
          uVar10 = 0;
          local_40 = pKVar6;
          while( true ) {
            if (local_38 <= (long)uVar10) {
              objs = local_40;
              return;
            }
            if (pMVar5 == (MppTrieInfo *)0x0) break;
            uaddr = 0;
            iVar1 = *(int *)(&pMVar5[1].field_0x0 + (byte)pMVar5->field_0x3);
            mpp_trie_init_by_root((MppTrie *)&uaddr,(void *)(root + (long)iVar1));
            if (uaddr == 0) {
              _mpp_log_l(2,"kmpp_obj","init %d:%d obj trie failed\n","kmpp_objs_init",
                         (ulong)local_44,uVar10 & 0xffffffff);
              objs = local_40;
              return;
            }
            ((KmppObjs *)(ppvVar9 + -3))->fd = (undefined4)uaddr;
            ((KmppObjs *)(ppvVar9 + -3))->count = uaddr._4_4_;
            pMVar7 = mpp_trie_get_info((MppTrie)uaddr,"__index");
            rVar4 = -1;
            if (pMVar7 != (MppTrieInfo *)0x0) {
              rVar4 = *(rk_s32 *)(&pMVar7[1].field_0x0 + (byte)pMVar7->field_0x3);
            }
            *(rk_s32 *)(ppvVar9 + -2) = rVar4;
            pMVar7 = mpp_trie_get_info((MppTrie)uaddr,"__size");
            if (pMVar7 == (MppTrieInfo *)0x0) {
              rVar4 = 0;
            }
            else {
              rVar4 = *(rk_s32 *)(&pMVar7[1].field_0x0 + (byte)pMVar7->field_0x3);
            }
            pMVar7 = pMVar5 + 1;
            *(rk_s32 *)(ppvVar9 + -1) = rVar4;
            *ppvVar9 = pMVar7;
            pMVar5 = mpp_trie_get_info_next(local_58,pMVar5);
            if (((byte)kmpp_obj_debug & 2) != 0) {
              _mpp_log_l(4,"kmpp_obj","%2d:%2d - %s offset %d entry_size %d\n",(char *)0x0,
                         (ulong)local_44,uVar10 & 0xffffffff,pMVar7,(long)iVar1,
                         (ulong)*(uint *)(ppvVar9 + -1));
            }
            uVar10 = uVar10 + 1;
            ppvVar9 = ppvVar9 + 4;
          }
          objs = local_40;
          return;
        }
        _mpp_log_l(2,"kmpp_obj","alloc objs failed\n","kmpp_objs_init");
      }
      else {
        _mpp_log_l(2,"kmpp_obj","init trie by root failed ret %d\n","kmpp_objs_init",
                   (ulong)(uint)MVar3);
      }
    }
    if (__fd != 0) {
      close(__fd);
    }
  }
  if (local_58 != (MppTrie)0x0) {
    mpp_trie_deinit(local_58);
  }
  return;
}

Assistant:

__attribute__ ((constructor))
void kmpp_objs_init(void)
{
    static const char *dev = "/dev/kmpp_objs";
    KmppObjs *p = objs;
    void *root = NULL;
    MppTrie trie = NULL;
    MppTrieInfo *info;
    rk_s32 fd = -1;
    rk_s32 offset;
    rk_s32 count;
    rk_s32 ret;
    rk_s32 i;

    if (p) {
        obj_dbg_flow("objs already inited %p\n", p);
        kmpp_objs_deinit();
        p = NULL;
    }

    mpp_env_get_u32("kmpp_obj_debug", &kmpp_obj_debug, 0);

    fd = open(dev, O_RDWR);
    if (fd < 0) {
        obj_dbg_flow("%s open failed ret fd %d\n", dev, fd);
        goto __failed;
    }

    {
        rk_u64 uaddr = 0;

        ret = ioctl(fd, KMPP_SHM_IOC_QUERY_INFO, &uaddr);
        if (ret < 0) {
            mpp_loge_f("%s ioctl failed ret %d\n", dev, ret);
            goto __failed;
        }

        root = (void *)(intptr_t)uaddr;
        obj_dbg_share("query fd %d root %p from kernel\n", fd, root);
    }

    ret = mpp_trie_init_by_root(&trie, root);
    if (ret || !trie) {
        mpp_loge_f("init trie by root failed ret %d\n", ret);
        goto __failed;
    }

    if (kmpp_obj_debug & OBJ_DBG_SHARE)
        mpp_trie_dump_f(trie);

    info = mpp_trie_get_info(trie, "__count");
    count = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;

    p = mpp_calloc_size(KmppObjs, sizeof(KmppObjs) + sizeof(KmppObjDefImpl) * count);
    if (!p) {
        mpp_loge_f("alloc objs failed\n");
        goto __failed;
    }

    p->fd = fd;
    p->count = count;
    p->trie = trie;
    p->root = root;

    info = mpp_trie_get_info(trie, "__offset");
    offset = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;
    p->entry_offset = offset;
    info = mpp_trie_get_info(trie, "__priv");
    offset = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;
    p->priv_offset = offset;
    info = mpp_trie_get_info(trie, "__name_offset");
    offset = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;
    p->name_offset = offset;

    obj_dbg_share("count %d object offsets - priv %d name %d entry %d\n", count,
                  p->priv_offset, p->name_offset, p->entry_offset);

    info = mpp_trie_get_info_first(trie);

    for (i = 0; i < count && info; i++) {
        KmppObjDefImpl *impl = &p->defs[i];
        const char *name = mpp_trie_info_name(info);
        MppTrie trie_objdef = NULL;
        MppTrieInfo *info_objdef;

        offset = *(rk_s32 *)mpp_trie_info_ctx(info);
        ret = mpp_trie_init_by_root(&trie_objdef, root + offset);
        if (!trie_objdef) {
            mpp_loge_f("init %d:%d obj trie failed\n", count, i);
            break;
        }

        impl->trie = trie_objdef;

        info_objdef = mpp_trie_get_info(trie_objdef, "__index");
        impl->index = info_objdef ? *(rk_s32 *)mpp_trie_info_ctx(info_objdef) : -1;
        info_objdef = mpp_trie_get_info(trie_objdef, "__size");
        impl->entry_size = info_objdef ? *(rk_s32 *)mpp_trie_info_ctx(info_objdef) : 0;
        impl->name = name;

        info = mpp_trie_get_info_next(trie, info);
        obj_dbg_share("%2d:%2d - %s offset %d entry_size %d\n",
                      count, i, name, offset, impl->entry_size);
    }

    objs = p;

    return;

__failed:
    if (fd > 0) {
        close(fd);
        fd = -1;
    }
    if (trie) {
        mpp_trie_deinit(trie);
        trie = NULL;
    }
}